

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  tdsize in_size;
  tdsize in_size_00;
  tdsize in_size_01;
  ostream *poVar1;
  void *pvVar2;
  string *this;
  void *pvVar3;
  fc_layer_t *this_00;
  ostream *poVar4;
  void *this_01;
  float fVar5;
  double dVar6;
  tensor_t<float> image_tensor;
  float total_error;
  fc_layer_t *layer4;
  pool_layer_t *layer3;
  relu_layer_t *layer2;
  conv_layer_t *layer1;
  vector<layer_t_*,_std::allocator<layer_t_*>_> layers;
  vector<case_t,_std::allocator<case_t>_> cases;
  Timer t;
  value_type *in_stack_fffffffffffffde8;
  conv_layer_t *in_stack_fffffffffffffdf0;
  tensor_t<float> *in_stack_fffffffffffffdf8;
  vector<layer_t_*,_std::allocator<layer_t_*>_> *in_stack_fffffffffffffe00;
  vector<case_t,_std::allocator<case_t>_> *in_stack_fffffffffffffe18;
  vector<layer_t_*,_std::allocator<layer_t_*>_> *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe40;
  float fVar7;
  string *file_name;
  undefined4 in_stack_fffffffffffffe88;
  uint16_t in_stack_fffffffffffffe8c;
  uint16_t in_stack_fffffffffffffe8e;
  int in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  string local_168 [16];
  tdsize in_stack_fffffffffffffea8;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  int iVar8;
  vector<case_t,_std::allocator<case_t>_> local_30;
  int local_4;
  
  local_4 = 0;
  Timer::Timer((Timer *)in_stack_fffffffffffffdf0);
  poVar1 = std::operator<<((ostream *)&std::cout,"Reading test cases.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  readTrainingData();
  std::vector<layer_t_*,_std::allocator<layer_t_*>_>::vector
            ((vector<layer_t_*,_std::allocator<layer_t_*>_> *)0x1024d3);
  poVar1 = std::operator<<((ostream *)&std::cout,"Creating layers.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  pvVar2 = operator_new(0xb0);
  std::vector<case_t,_std::allocator<case_t>_>::operator[](&local_30,0);
  in_size_00.z = in_stack_ffffffffffffff30;
  in_size_00.x = (int)in_stack_ffffffffffffff28;
  in_size_00.y = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  conv_layer_t::conv_layer_t
            ((conv_layer_t *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (uint16_t)((ulong)in_stack_ffffffffffffff08 >> 0x30),
             (uint16_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
             (uint16_t)((ulong)in_stack_ffffffffffffff08 >> 0x10),in_size_00);
  this = (string *)operator_new(0x7c);
  in_size.y._0_2_ = in_stack_fffffffffffffe8c;
  in_size.x = in_stack_fffffffffffffe88;
  in_size.y._2_2_ = in_stack_fffffffffffffe8e;
  in_size.z = in_stack_fffffffffffffe90;
  relu_layer_t::relu_layer_t((relu_layer_t *)poVar1,in_size);
  file_name = this;
  pvVar3 = operator_new(0x80);
  iVar8 = (int)*(undefined8 *)(this + 0x6c);
  pool_layer_t::pool_layer_t
            ((pool_layer_t *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe8e,in_stack_fffffffffffffe8c,in_stack_fffffffffffffea8);
  this_00 = (fc_layer_t *)operator_new(0xd4);
  in_size_01.z = iVar8;
  in_size_01.x = (int)in_stack_ffffffffffffff28;
  in_size_01.y = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  fc_layer_t::fc_layer_t
            ((fc_layer_t *)CONCAT44(in_stack_ffffffffffffff14,*(undefined4 *)((long)pvVar3 + 0x74)),
             in_size_01,(int)((ulong)*(undefined8 *)((long)pvVar3 + 0x6c) >> 0x20));
  std::vector<layer_t_*,_std::allocator<layer_t_*>_>::push_back
            ((vector<layer_t_*,_std::allocator<layer_t_*>_> *)in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8);
  std::vector<layer_t_*,_std::allocator<layer_t_*>_>::push_back
            ((vector<layer_t_*,_std::allocator<layer_t_*>_> *)in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8);
  std::vector<layer_t_*,_std::allocator<layer_t_*>_>::push_back
            ((vector<layer_t_*,_std::allocator<layer_t_*>_> *)in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8);
  std::vector<layer_t_*,_std::allocator<layer_t_*>_>::push_back
            ((vector<layer_t_*,_std::allocator<layer_t_*>_> *)in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8);
  Timer::start((Timer *)in_stack_fffffffffffffdf0);
  fVar5 = trainCNN(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  fVar7 = fVar5;
  Timer::stop((Timer *)in_stack_fffffffffffffdf0);
  std::operator<<((ostream *)&std::cout,"Training completed.\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"  Time (baseline): ");
  dVar6 = Timer::seconds((Timer *)in_stack_fffffffffffffdf0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar1,dVar6);
  std::operator<<(poVar4," s.\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"  Total error: ");
  this_01 = (void *)std::ostream::operator<<(poVar4,fVar5);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"../test.ppm",(allocator *)&stack0xfffffffffffffe97);
  loadImageAsTensor(file_name);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe97);
  forward(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  std::vector<layer_t_*,_std::allocator<layer_t_*>_>::vector
            ((vector<layer_t_*,_std::allocator<layer_t_*>_> *)
             CONCAT44(fVar7,in_stack_fffffffffffffe40),
             (vector<layer_t_*,_std::allocator<layer_t_*>_> *)poVar1);
  printResult(in_stack_fffffffffffffe00);
  std::vector<layer_t_*,_std::allocator<layer_t_*>_>::~vector(in_stack_fffffffffffffe00);
  if (pvVar2 != (void *)0x0) {
    conv_layer_t::~conv_layer_t(in_stack_fffffffffffffdf0);
    operator_delete(pvVar2);
  }
  if (this != (string *)0x0) {
    relu_layer_t::~relu_layer_t((relu_layer_t *)0x102988);
    operator_delete(this);
  }
  if (pvVar3 != (void *)0x0) {
    pool_layer_t::~pool_layer_t((pool_layer_t *)0x1029af);
    operator_delete(pvVar3);
  }
  if (this_00 != (fc_layer_t *)0x0) {
    fc_layer_t::~fc_layer_t(this_00);
    operator_delete(this_00);
  }
  local_4 = 0;
  tensor_t<float>::~tensor_t((tensor_t<float> *)0x1029f8);
  std::vector<layer_t_*,_std::allocator<layer_t_*>_>::~vector
            ((vector<layer_t_*,_std::allocator<layer_t_*>_> *)this);
  std::vector<case_t,_std::allocator<case_t>_>::~vector
            ((vector<case_t,_std::allocator<case_t>_> *)this);
  return local_4;
}

Assistant:

int main() {
  Timer t;

  /* Training phase */
  std::cout << "Reading test cases." << std::endl;
  std::vector<case_t> cases = readTrainingData();

  std::vector<layer_t *> layers;

  // The following layers make up the CNN in sequence.
  std::cout << "Creating layers." << std::endl;
  auto layer1 = new conv_layer_t(1, 5, 8, cases[0].data.size);
  auto layer2 = new relu_layer_t(layer1->out.size);
  auto layer3 = new pool_layer_t(2, 2, layer2->out.size);
  auto layer4 = new fc_layer_t(layer3->out.size, 10);

  // Push the layers into a vector of layers.
  layers.push_back(layer1);
  layers.push_back(layer2);
  layers.push_back(layer3);
  layers.push_back(layer4);

  // Train the CNN
  t.start();
  auto total_error = trainCNN(layers, cases);
  t.stop();
  std::cout << "Training completed.\n";
  std::cout << "  Time (baseline): " << t.seconds() << " s.\n";
  std::cout << "  Total error: " << total_error << std::endl;

  /* Test inference */
  // Load the test image
  auto image_tensor = loadImageAsTensor("../test.ppm");

  // Infer the CNN with the result image
  forward(layers, image_tensor);

  printResult(layers);

  delete layer1;
  delete layer2;
  delete layer3;
  delete layer4;

  return 0;

}